

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint * stack(uint *a,uint alen,uint *b,uint blen,uint *out_size)

{
  uint *puVar1;
  uint local_48;
  uint local_44;
  uint i;
  uint *c;
  uint size;
  uint *out_size_local;
  uint blen_local;
  uint *b_local;
  uint alen_local;
  uint *a_local;
  
  if (out_size != (uint *)0x0) {
    *out_size = alen + blen;
  }
  puVar1 = vector_new(alen + blen);
  for (local_44 = 0; local_44 < alen + blen; local_44 = local_44 + 1) {
    if (local_44 < alen) {
      local_48 = a[local_44];
    }
    else {
      local_48 = b[local_44 - alen];
    }
    puVar1[local_44] = local_48;
  }
  return puVar1;
}

Assistant:

uint32_t *stack(uint32_t *a, uint32_t alen, uint32_t *b, uint32_t blen, uint32_t *out_size)
{
    uint32_t size = alen + blen;
    if (out_size != NULL)
        *out_size = alen + blen;

    uint32_t *c = vector_new(size);

    for (uint32_t i = 0; i < size; i++)
        c[i] = i < alen ? a[i] : b[i - alen];
    return c;
}